

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

char * message_sound_name(int message)

{
  if (0x98 < (uint)message) {
    return (char *)0x0;
  }
  return message_lookup_by_sound_name::sound_names[(uint)message];
}

Assistant:

const char *message_sound_name(int message)
{
	static const char *sound_names[] = {
		#define MSG(x, s) s,
		#include "list-message.h"
		#undef MSG
	};

	if (message < MSG_GENERIC || message >= MSG_MAX)
		return NULL;

	return sound_names[message];
}